

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.cc
# Opt level: O0

void saveFaces(Mat *img,Mat *img_gray)

{
  ulong uVar1;
  size_type sVar2;
  reference r;
  vector<int,_std::allocator<int>_> local_338;
  Mat local_318 [96];
  _InputArray local_2b8;
  undefined1 local_2a0 [8];
  Rect roi;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  undefined1 local_250 [8];
  string saveName;
  stringstream buffer;
  ostream local_220 [376];
  ulong local_a8;
  size_t i;
  Mat local_90 [96];
  undefined1 local_30 [8];
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> faces;
  Mat *img_gray_local;
  Mat *img_local;
  
  faces.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)img_gray;
  cv::Mat::Mat(local_90,img_gray);
  detectFaces((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_30,local_90);
  cv::Mat::~Mat(local_90);
  local_a8 = 0;
  while( true ) {
    uVar1 = local_a8;
    sVar2 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::size
                      ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_30);
    if (sVar2 <= uVar1) break;
    std::__cxx11::stringstream::stringstream((stringstream *)(saveName.field_2._M_local_buf + 8));
    std::ostream::operator<<(local_220,local_a8);
    std::__cxx11::stringstream::str();
    std::operator+(&local_270,"smile",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&roi.width);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250,
                   &local_270,".png");
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&roi.width);
    r = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                  ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_30,local_a8);
    cv::Rect_<int>::Rect_((Rect_<int> *)local_2a0,r);
    cv::Mat::operator()(local_318,(Rect *)img);
    cv::_InputArray::_InputArray(&local_2b8,local_318);
    local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_338.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::vector(&local_338);
    cv::imwrite((string *)local_250,&local_2b8,(vector *)&local_338);
    std::vector<int,_std::allocator<int>_>::~vector(&local_338);
    cv::_InputArray::~_InputArray(&local_2b8);
    cv::Mat::~Mat(local_318);
    std::__cxx11::string::~string((string *)local_250);
    std::__cxx11::stringstream::~stringstream((stringstream *)(saveName.field_2._M_local_buf + 8));
    local_a8 = local_a8 + 1;
  }
  std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~vector
            ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_30);
  return;
}

Assistant:

void saveFaces(Mat img, Mat img_gray) {
  vector<Rect> faces = detectFaces(img_gray);
  for (size_t i = 0; i < faces.size(); i++) {
    stringstream buffer;
    buffer << i;
    string saveName = "smile" + buffer.str() + ".png";
    Rect roi = faces[i];
    imwrite(saveName, img(roi));
  }
}